

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretTime.c
# Opt level: O0

void Abc_FlowRetime_ConstrainExact(Abc_Obj_t *pObj)

{
  Flow_Data_t *pFVar1;
  uint uVar2;
  Abc_Obj_t *pObj_local;
  
  pFVar1 = pManMR->pDataArray;
  uVar2 = Abc_ObjId(pObj);
  if ((undefined1  [24])((undefined1  [24])pFVar1[uVar2] & (undefined1  [24])0x80) !=
      (undefined1  [24])0x0) {
    pManMR->nConservConstraints = pManMR->nConservConstraints + -1;
    pFVar1 = pManMR->pDataArray;
    uVar2 = Abc_ObjId(pObj);
    *(ushort *)(pFVar1 + uVar2) = *(ushort *)(pFVar1 + uVar2) & 0xff7f;
  }
  if (pManMR->fIsForward == 0) {
    Abc_FlowRetime_ConstrainExact_back(pObj);
  }
  else {
    Abc_FlowRetime_ConstrainExact_forw(pObj);
  }
  return;
}

Assistant:

void Abc_FlowRetime_ConstrainExact( Abc_Obj_t * pObj ) {

  if (FTEST( pObj, CONSERVATIVE )) {
    pManMR->nConservConstraints--;
    FUNSET( pObj, CONSERVATIVE );
  }

#if !defined(IGNORE_TIMING)
  if (pManMR->fIsForward) {
    Abc_FlowRetime_ConstrainExact_forw(pObj);
  } else {
    Abc_FlowRetime_ConstrainExact_back(pObj);
  }
#endif
}